

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UBXProtocol.h
# Opt level: O1

int ProcessPacketUBX(uchar *packet,int packetlen,int mclass,int mid,UBXDATA *pUBXData)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar *__src;
  
  if (mclass != 1) {
    if (mclass != 5) {
      return 0;
    }
    if (mid != 0) {
      return 0;
    }
    printf("UBX packet not acknowledged : mclass = %02x, mid = %02x. \n",5,0);
    return 1;
  }
  __src = packet + 6;
  if (mid < 0x12) {
    switch(mid) {
    case 2:
      uVar2 = *(undefined8 *)__src;
      uVar3 = *(undefined8 *)(packet + 0xe);
      uVar4 = *(undefined8 *)(packet + 0x12);
      uVar5 = *(undefined8 *)(packet + 0x1a);
      (pUBXData->nav_posllh_pl).iTOW = (int)uVar2;
      (pUBXData->nav_posllh_pl).lon = (int)((ulong)uVar2 >> 0x20);
      (pUBXData->nav_posllh_pl).lat = (int)uVar3;
      (pUBXData->nav_posllh_pl).height = (int)((ulong)uVar3 >> 0x20);
      (pUBXData->nav_posllh_pl).height = (int)uVar4;
      (pUBXData->nav_posllh_pl).hMSL = (int)((ulong)uVar4 >> 0x20);
      (pUBXData->nav_posllh_pl).hAcc = (int)uVar5;
      (pUBXData->nav_posllh_pl).vAcc = (int)((ulong)uVar5 >> 0x20);
      pUBXData->Latitude = (double)(pUBXData->nav_posllh_pl).lat * 1e-07;
      pUBXData->Longitude = (double)(pUBXData->nav_posllh_pl).lon * 1e-07;
      pUBXData->Altitude = (double)((pUBXData->nav_posllh_pl).height * 1000);
      break;
    case 3:
      uVar2 = *(undefined8 *)__src;
      uVar3 = *(undefined8 *)(packet + 0xe);
      (pUBXData->nav_status_pl).iTOW = (int)uVar2;
      (pUBXData->nav_status_pl).gpsFix = (char)((ulong)uVar2 >> 0x20);
      (pUBXData->nav_status_pl).flags = (flags_NAV_STATUS_PL_UBX)(char)((ulong)uVar2 >> 0x28);
      (pUBXData->nav_status_pl).fixStat = (fixStat_NAV_STATUS_PL_UBX)(char)((ulong)uVar2 >> 0x30);
      (pUBXData->nav_status_pl).flags2 = (flags2_NAV_STATUS_PL_UBX)(char)((ulong)uVar2 >> 0x38);
      (pUBXData->nav_status_pl).ttff = (int)uVar3;
      (pUBXData->nav_status_pl).msss = (int)((ulong)uVar3 >> 0x20);
      break;
    case 6:
      *(undefined4 *)(pUBXData->nav_sol_pl).reserved2 = *(undefined4 *)(packet + 0x36);
      uVar2 = *(undefined8 *)__src;
      uVar3 = *(undefined8 *)(packet + 0xe);
      uVar4 = *(undefined8 *)(packet + 0x16);
      uVar5 = *(undefined8 *)(packet + 0x1e);
      uVar6 = *(undefined8 *)(packet + 0x26);
      uVar7 = *(undefined8 *)(packet + 0x2e);
      (pUBXData->nav_sol_pl).ecefVY = (int)uVar6;
      (pUBXData->nav_sol_pl).ecefVZ = (int)((ulong)uVar6 >> 0x20);
      (pUBXData->nav_sol_pl).sAcc = (int)uVar7;
      (pUBXData->nav_sol_pl).pDOP = (short)((ulong)uVar7 >> 0x20);
      (pUBXData->nav_sol_pl).reserved1 = (char)((ulong)uVar7 >> 0x30);
      (pUBXData->nav_sol_pl).numSV = (char)((ulong)uVar7 >> 0x38);
      (pUBXData->nav_sol_pl).ecefY = (int)uVar4;
      (pUBXData->nav_sol_pl).ecefZ = (int)((ulong)uVar4 >> 0x20);
      (pUBXData->nav_sol_pl).pAcc = (int)uVar5;
      (pUBXData->nav_sol_pl).ecefVX = (int)((ulong)uVar5 >> 0x20);
      (pUBXData->nav_sol_pl).iTOW = (int)uVar2;
      (pUBXData->nav_sol_pl).fTOW = (int)((ulong)uVar2 >> 0x20);
      (pUBXData->nav_sol_pl).week = (short)uVar3;
      (pUBXData->nav_sol_pl).gpsFix = (char)((ulong)uVar3 >> 0x10);
      (pUBXData->nav_sol_pl).flags = (flags_NAV_SOL_PL_UBX)(char)((ulong)uVar3 >> 0x18);
      (pUBXData->nav_sol_pl).ecefX = (int)((ulong)uVar3 >> 0x20);
      break;
    case 7:
      memcpy(&pUBXData->nav_pvt_pl,__src,0x5c);
      pUBXData->Latitude = (double)(pUBXData->nav_pvt_pl).lat * 1e-07;
      pUBXData->Longitude = (double)(pUBXData->nav_pvt_pl).lon * 1e-07;
      pUBXData->Altitude = (double)((pUBXData->nav_pvt_pl).height * 1000);
      pUBXData->year = (uint)(pUBXData->nav_pvt_pl).year;
      pUBXData->month = (uint)(pUBXData->nav_pvt_pl).month;
      pUBXData->day = (uint)(pUBXData->nav_pvt_pl).day;
      pUBXData->hour = (uint)(pUBXData->nav_pvt_pl).hour;
      pUBXData->minute = (uint)(pUBXData->nav_pvt_pl).minute;
      pUBXData->second =
           (double)(pUBXData->nav_pvt_pl).nano * 1e-09 + (double)(pUBXData->nav_pvt_pl).sec;
      pUBXData->SOG = (double)(pUBXData->nav_pvt_pl).gSpeed / 1000.0;
      iVar1 = (pUBXData->nav_pvt_pl).headMot;
      goto LAB_0012ad9e;
    }
  }
  else {
    if (0x3a < mid) {
      if (mid == 0x3b) {
        uVar2 = *(undefined8 *)(packet + 0x26);
        (pUBXData->nav_svin_pl).obs = (int)uVar2;
        (pUBXData->nav_svin_pl).valid = (char)((ulong)uVar2 >> 0x20);
        (pUBXData->nav_svin_pl).active = (char)((ulong)uVar2 >> 0x28);
        (pUBXData->nav_svin_pl).reserved3[0] = (char)((ulong)uVar2 >> 0x30);
        (pUBXData->nav_svin_pl).reserved3[1] = (char)((ulong)uVar2 >> 0x38);
        uVar2 = *(undefined8 *)__src;
        uVar3 = *(undefined8 *)(packet + 0xe);
        uVar4 = *(undefined8 *)(packet + 0x16);
        uVar5 = *(undefined8 *)(packet + 0x1e);
        (pUBXData->nav_svin_pl).meanY = (int)uVar4;
        (pUBXData->nav_svin_pl).meanZ = (int)((ulong)uVar4 >> 0x20);
        (pUBXData->nav_svin_pl).meanXHP = (char)uVar5;
        (pUBXData->nav_svin_pl).meanYHP = (char)((ulong)uVar5 >> 8);
        (pUBXData->nav_svin_pl).meanZHP = (char)((ulong)uVar5 >> 0x10);
        (pUBXData->nav_svin_pl).reserved2 = (char)((ulong)uVar5 >> 0x18);
        (pUBXData->nav_svin_pl).meanAcc = (int)((ulong)uVar5 >> 0x20);
        (pUBXData->nav_svin_pl).version = (char)uVar2;
        (pUBXData->nav_svin_pl).reserved1[0] = (char)((ulong)uVar2 >> 8);
        (pUBXData->nav_svin_pl).reserved1[1] = (char)((ulong)uVar2 >> 0x10);
        (pUBXData->nav_svin_pl).reserved1[2] = (char)((ulong)uVar2 >> 0x18);
        (pUBXData->nav_svin_pl).iTOW = (int)((ulong)uVar2 >> 0x20);
        (pUBXData->nav_svin_pl).dur = (int)uVar3;
        (pUBXData->nav_svin_pl).meanX = (int)((ulong)uVar3 >> 0x20);
        return 0;
      }
      if (mid != 0x3c) {
        return 0;
      }
      uVar2 = *(undefined8 *)__src;
      uVar3 = *(undefined8 *)(packet + 0xe);
      uVar4 = *(undefined8 *)(packet + 0x16);
      uVar5 = *(undefined8 *)(packet + 0x1e);
      uVar6 = *(undefined8 *)(packet + 0x26);
      uVar7 = *(undefined8 *)(packet + 0x2e);
      uVar8 = *(undefined8 *)(packet + 0x36);
      uVar9 = packet[0x3e];
      uVar10 = packet[0x3f];
      uVar11 = packet[0x40];
      uVar12 = packet[0x41];
      uVar13 = packet[0x42];
      uVar14 = packet[0x43];
      uVar15 = packet[0x44];
      uVar16 = packet[0x45];
      (pUBXData->nav_relposned_pl).relPosD = (int)uVar4;
      (pUBXData->nav_relposned_pl).relPosLength = (int)((ulong)uVar4 >> 0x20);
      (pUBXData->nav_relposned_pl).relPosHeading = (int)uVar5;
      (pUBXData->nav_relposned_pl).reserved1[0] = (char)((ulong)uVar5 >> 0x20);
      (pUBXData->nav_relposned_pl).reserved1[1] = (char)((ulong)uVar5 >> 0x28);
      (pUBXData->nav_relposned_pl).reserved1[2] = (char)((ulong)uVar5 >> 0x30);
      (pUBXData->nav_relposned_pl).reserved1[3] = (char)((ulong)uVar5 >> 0x38);
      (pUBXData->nav_relposned_pl).accLength = (int)uVar8;
      (pUBXData->nav_relposned_pl).accHeading = (int)((ulong)uVar8 >> 0x20);
      (pUBXData->nav_relposned_pl).reserved2[0] = uVar9;
      (pUBXData->nav_relposned_pl).reserved2[1] = uVar10;
      (pUBXData->nav_relposned_pl).reserved2[2] = uVar11;
      (pUBXData->nav_relposned_pl).reserved2[3] = uVar12;
      (pUBXData->nav_relposned_pl).flags.field_0x0 = uVar13;
      (pUBXData->nav_relposned_pl).flags.field_0x1 = uVar14;
      (pUBXData->nav_relposned_pl).flags.field_0x2 = uVar15;
      (pUBXData->nav_relposned_pl).flags.field_0x3 = uVar16;
      (pUBXData->nav_relposned_pl).relPosHPN = (char)uVar6;
      (pUBXData->nav_relposned_pl).relPosHPE = (char)((ulong)uVar6 >> 8);
      (pUBXData->nav_relposned_pl).relPosHPD = (char)((ulong)uVar6 >> 0x10);
      (pUBXData->nav_relposned_pl).relPosHPPLength = (char)((ulong)uVar6 >> 0x18);
      (pUBXData->nav_relposned_pl).accN = (int)((ulong)uVar6 >> 0x20);
      (pUBXData->nav_relposned_pl).accE = (int)uVar7;
      (pUBXData->nav_relposned_pl).accD = (int)((ulong)uVar7 >> 0x20);
      (pUBXData->nav_relposned_pl).version = (char)uVar2;
      (pUBXData->nav_relposned_pl).reserved0 = (char)((ulong)uVar2 >> 8);
      (pUBXData->nav_relposned_pl).refStationId = (short)((ulong)uVar2 >> 0x10);
      (pUBXData->nav_relposned_pl).iTOW = (int)((ulong)uVar2 >> 0x20);
      (pUBXData->nav_relposned_pl).relPosN = (int)uVar3;
      (pUBXData->nav_relposned_pl).relPosE = (int)((ulong)uVar3 >> 0x20);
      pUBXData->Heading =
           ((double)(pUBXData->nav_relposned_pl).relPosHeading * 1e-05 * 3.141592653589793) / 180.0;
      return 0;
    }
    if (mid != 0x12) {
      if (mid != 0x14) {
        return 0;
      }
      uVar2 = *(undefined8 *)__src;
      uVar3 = *(undefined8 *)(packet + 0xe);
      uVar4 = *(undefined8 *)(packet + 0x16);
      uVar5 = *(undefined8 *)(packet + 0x1e);
      (pUBXData->nav_hposllh_pl).version = (char)uVar2;
      (pUBXData->nav_hposllh_pl).reserved0[0] = (char)((ulong)uVar2 >> 8);
      (pUBXData->nav_hposllh_pl).reserved0[1] = (char)((ulong)uVar2 >> 0x10);
      (pUBXData->nav_hposllh_pl).flags = (flags_NAV_HPOSLLH_PL_UBX)(char)((ulong)uVar2 >> 0x18);
      (pUBXData->nav_hposllh_pl).iTOW = (int)((ulong)uVar2 >> 0x20);
      (pUBXData->nav_hposllh_pl).lon = (int)uVar3;
      (pUBXData->nav_hposllh_pl).lat = (int)((ulong)uVar3 >> 0x20);
      (pUBXData->nav_hposllh_pl).height = (int)uVar4;
      (pUBXData->nav_hposllh_pl).hMSL = (int)((ulong)uVar4 >> 0x20);
      (pUBXData->nav_hposllh_pl).lonHp = (char)uVar5;
      (pUBXData->nav_hposllh_pl).latHp = (char)((ulong)uVar5 >> 8);
      (pUBXData->nav_hposllh_pl).heightHp = (char)((ulong)uVar5 >> 0x10);
      (pUBXData->nav_hposllh_pl).hMSLHp = (char)((ulong)uVar5 >> 0x18);
      (pUBXData->nav_hposllh_pl).hAcc = (int)((ulong)uVar5 >> 0x20);
      (pUBXData->nav_hposllh_pl).vAcc = *(uint *)(packet + 0x26);
      pUBXData->Latitude =
           ((double)(int)(pUBXData->nav_hposllh_pl).latHp * 0.01 +
           (double)(pUBXData->nav_hposllh_pl).lat) * 1e-07;
      pUBXData->Longitude =
           ((double)(int)(pUBXData->nav_hposllh_pl).lonHp * 0.01 +
           (double)(pUBXData->nav_hposllh_pl).lon) * 1e-07;
      pUBXData->Altitude =
           ((double)(int)(pUBXData->nav_hposllh_pl).heightHp * 0.1 +
           (double)(pUBXData->nav_hposllh_pl).height) * 1000.0;
      return 0;
    }
    uVar2 = *(undefined8 *)__src;
    uVar3 = *(undefined8 *)(packet + 0xe);
    uVar4 = *(undefined8 *)(packet + 0x16);
    uVar5 = *(undefined8 *)(packet + 0x1e);
    (pUBXData->nav_velned_pl).speed = (int)uVar4;
    (pUBXData->nav_velned_pl).gSpeed = (int)((ulong)uVar4 >> 0x20);
    (pUBXData->nav_velned_pl).heading = (int)uVar5;
    (pUBXData->nav_velned_pl).sAcc = (int)((ulong)uVar5 >> 0x20);
    (pUBXData->nav_velned_pl).cAcc = *(uint *)(packet + 0x26);
    (pUBXData->nav_velned_pl).iTOW = (int)uVar2;
    (pUBXData->nav_velned_pl).velN = (int)((ulong)uVar2 >> 0x20);
    (pUBXData->nav_velned_pl).velE = (int)uVar3;
    (pUBXData->nav_velned_pl).velD = (int)((ulong)uVar3 >> 0x20);
    pUBXData->SOG = (double)(pUBXData->nav_velned_pl).gSpeed / 100.0;
    iVar1 = (pUBXData->nav_velned_pl).heading;
LAB_0012ad9e:
    pUBXData->COG = ((double)iVar1 * 1e-05 * 3.141592653589793) / 180.0;
  }
  return 0;
}

Assistant:

inline int ProcessPacketUBX(unsigned char* packet, int packetlen, int mclass, int mid, UBXDATA* pUBXData)
{
	unsigned char* payload = packet+MIN_PACKET_LENGTH_UBX-NB_BYTES_CHECKSUM_UBX;
	int payloadlen = packetlen-MIN_PACKET_LENGTH_UBX;

	UNREFERENCED_PARAMETER(payloadlen);

	//memset(pUBXData, 0, sizeof(UBXDATA));

	switch (mclass)
	{
	case ACK_CLASS_UBX:
		switch (mid)
		{
		case ACK_ACK_ID_UBX:
			break;
		case ACK_NAK_ID_UBX:
			printf("UBX packet not acknowledged : mclass = %02x, mid = %02x. \n", (int)(unsigned char)mclass, (int)(unsigned char)mid);
			return EXIT_FAILURE;
		default:
			// Unhandled...
			break;
		}
		break;
	case NAV_CLASS_UBX:
		switch (mid)
		{
		case NAV_HPOSLLH_ID_UBX:
			memcpy(&pUBXData->nav_hposllh_pl, payload, LEN_NAV_HPOSLLH_PL_UBX);
			//memcpy(&pUBXData->nav_hposllh_pl, payload, sizeof(pUBXData->nav_hposllh_pl));
			pUBXData->Latitude = (pUBXData->nav_hposllh_pl.lat+pUBXData->nav_hposllh_pl.latHp*0.01)*0.0000001; // In decimal degrees.
			pUBXData->Longitude = (pUBXData->nav_hposllh_pl.lon+pUBXData->nav_hposllh_pl.lonHp*0.01)*0.0000001; // In decimal degrees.
			pUBXData->Altitude = (pUBXData->nav_hposllh_pl.height+pUBXData->nav_hposllh_pl.heightHp*0.1)*1000; // In m.
			break;
		case NAV_POSLLH_ID_UBX:
			memcpy(&pUBXData->nav_posllh_pl, payload, LEN_NAV_POSLLH_PL_UBX);
			//memcpy(&pUBXData->nav_posllh_pl, payload, sizeof(pUBXData->nav_posllh_pl));
			pUBXData->Latitude = pUBXData->nav_posllh_pl.lat*0.0000001; // In decimal degrees.
			pUBXData->Longitude = pUBXData->nav_posllh_pl.lon*0.0000001; // In decimal degrees.
			pUBXData->Altitude = pUBXData->nav_posllh_pl.height*1000; // In m.
			break;
		case NAV_PVT_ID_UBX:
			memcpy(&pUBXData->nav_pvt_pl, payload, LEN_NAV_PVT_PL_UBX);
			//memcpy(&pUBXData->nav_pvt_pl, payload, sizeof(pUBXData->nav_pvt_pl));
			pUBXData->Latitude = pUBXData->nav_pvt_pl.lat*0.0000001; // In decimal degrees.
			pUBXData->Longitude = pUBXData->nav_pvt_pl.lon*0.0000001; // In decimal degrees.
			pUBXData->Altitude = pUBXData->nav_pvt_pl.height*1000; // In m.
			pUBXData->year = pUBXData->nav_pvt_pl.year;
			pUBXData->month = pUBXData->nav_pvt_pl.month;
			pUBXData->day = pUBXData->nav_pvt_pl.day;
			pUBXData->hour = pUBXData->nav_pvt_pl.hour;
			pUBXData->minute = pUBXData->nav_pvt_pl.minute; 
			pUBXData->second = pUBXData->nav_pvt_pl.sec+0.000000001*pUBXData->nav_pvt_pl.nano;	
			pUBXData->SOG = pUBXData->nav_pvt_pl.gSpeed/1000.0; // In m/s.
			pUBXData->COG = pUBXData->nav_pvt_pl.headMot*0.00001*M_PI/180.0; // In rad.
			break;
		case NAV_RELPOSNED_ID_UBX:
			memcpy(&pUBXData->nav_relposned_pl, payload, LEN_NAV_RELPOSNED_PL_UBX);
			//memcpy(&pUBXData->nav_relposned_pl, payload, sizeof(pUBXData->nav_relposned_pl));
			pUBXData->Heading = pUBXData->nav_relposned_pl.relPosHeading*0.00001*M_PI/180.0; // In rad
			break;
		case NAV_SOL_ID_UBX:
			memcpy(&pUBXData->nav_sol_pl, payload, LEN_NAV_SOL_PL_UBX);
			//memcpy(&pUBXData->nav_sol_pl, payload, sizeof(pUBXData->nav_sol_pl));
			break;
		case NAV_STATUS_ID_UBX:
			memcpy(&pUBXData->nav_status_pl, payload, LEN_NAV_STATUS_PL_UBX);
			//memcpy(&pUBXData->nav_status_pl, payload, sizeof(pUBXData->nav_status_pl));
			break;
		case NAV_SVIN_ID_UBX:
			memcpy(&pUBXData->nav_svin_pl, payload, LEN_NAV_SVIN_PL_UBX);
			//memcpy(&pUBXData->nav_svin_pl, payload, sizeof(pUBXData->nav_svin_pl));
			break;
		case NAV_VELNED_ID_UBX:
			memcpy(&pUBXData->nav_velned_pl, payload, LEN_NAV_VELNED_PL_UBX);
			//memcpy(&pUBXData->nav_velned_pl, payload, sizeof(pUBXData->nav_velned_pl));
			pUBXData->SOG = pUBXData->nav_velned_pl.gSpeed/100.0; // In m/s.
			pUBXData->COG = pUBXData->nav_velned_pl.heading*0.00001*M_PI/180.0; // In rad.
			break;
		default:
			// Unhandled...
			break;
		}
		break;
	default:
		// Unhandled...
		break;
	}

	return EXIT_SUCCESS;
}